

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cc
# Opt level: O0

void dtc::push_string(byte_buffer *buffer,string *s,bool escapes)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  byte *pbVar5;
  ulong uVar6;
  ulong uVar7;
  char *pcVar8;
  byte local_3c;
  byte local_38;
  int v_1;
  int v;
  uint8_t c;
  size_t i;
  size_t length;
  string *psStack_18;
  bool escapes_local;
  string *s_local;
  byte_buffer *buffer_local;
  
  length._7_1_ = escapes;
  psStack_18 = s;
  s_local = (string *)buffer;
  i = std::__cxx11::string::size();
  _v = 0;
  do {
    if (i <= _v) {
      return;
    }
    pbVar5 = (byte *)std::__cxx11::string::operator[]((ulong)psStack_18);
    v_1._3_1_ = *pbVar5;
    if ((((length._7_1_ & 1) != 0) && (v_1._3_1_ == 0x5c)) && (_v + 1 < i)) {
      _v = _v + 1;
      pbVar5 = (byte *)std::__cxx11::string::operator[]((ulong)psStack_18);
      v_1._3_1_ = *pbVar5;
      switch(v_1._3_1_) {
      default:
      case 0x22:
      case 0x27:
      case 0x5c:
        break;
      case 0x30:
      case 0x31:
      case 0x32:
      case 0x33:
      case 0x34:
      case 0x35:
      case 0x36:
      case 0x37:
        iVar3 = anon_unknown.dwarf_8f23a::digittoint((uint)v_1._3_1_);
        local_38 = (byte)iVar3;
        if (((_v + 1 < i) &&
            (pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)psStack_18), *pcVar8 < '8'))
           && (pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)psStack_18), '/' < *pcVar8))
        {
          pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)psStack_18);
          uVar2 = anon_unknown.dwarf_8f23a::digittoint((int)*pcVar8);
          uVar2 = uVar2 | iVar3 << 3;
          local_38 = (byte)uVar2;
          uVar6 = _v + 1;
          uVar7 = _v + 2;
          _v = uVar6;
          if (((uVar7 < i) &&
              (pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)psStack_18), *pcVar8 < '8'))
             && (pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)psStack_18), '/' < *pcVar8
                )) {
            pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)psStack_18);
            iVar3 = anon_unknown.dwarf_8f23a::digittoint((int)*pcVar8);
            local_38 = (byte)iVar3 | (byte)(uVar2 << 3);
          }
        }
        v_1._3_1_ = local_38;
        break;
      case 0x61:
        v_1._3_1_ = 7;
        break;
      case 0x62:
        v_1._3_1_ = 8;
        break;
      case 0x66:
        v_1._3_1_ = 0xc;
        break;
      case 0x6e:
        v_1._3_1_ = 10;
        break;
      case 0x72:
        v_1._3_1_ = 0xd;
        break;
      case 0x74:
        v_1._3_1_ = 9;
        break;
      case 0x76:
        v_1._3_1_ = 0xb;
        break;
      case 0x78:
        _v = _v + 1;
        if (_v < i) {
          pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)psStack_18);
          iVar3 = anon_unknown.dwarf_8f23a::digittoint((int)*pcVar8);
          local_3c = (byte)iVar3;
          if (_v + 1 < i) {
            pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)psStack_18);
            bVar1 = ishexdigit(*pcVar8);
            if (bVar1) {
              _v = _v + 1;
              pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)psStack_18);
              iVar4 = anon_unknown.dwarf_8f23a::digittoint((int)*pcVar8);
              local_3c = (byte)iVar4 | (byte)(iVar3 << 4);
            }
          }
          v_1._3_1_ = local_3c;
        }
      }
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)s_local,
               (value_type_conflict1 *)((long)&v_1 + 3));
    _v = _v + 1;
  } while( true );
}

Assistant:

void
push_string(byte_buffer &buffer, const string &s, bool escapes)
{
	size_t length = s.size();
	for (size_t i=0 ; i<length ; ++i)
	{
		uint8_t c = s[i];
		if (escapes && c == '\\' && i+1 < length)
		{
			c = s[++i];
			switch (c)
			{
				// For now, we just ignore invalid escape sequences.
				default:
				case '"':
				case '\'':
				case '\\':
					break;
				case 'a':
					c = '\a';
					break;
				case 'b':
					c = '\b';
					break;
				case 't':
					c = '\t';
					break;
				case 'n':
					c = '\n';
					break;
				case 'v':
					c = '\v';
					break;
				case 'f':
					c = '\f';
					break;
				case 'r':
					c = '\r';
					break;
				case '0'...'7':
				{
					int v = digittoint(c);
					if (i+1 < length && s[i+1] <= '7' && s[i+1] >= '0')
					{
						v <<= 3;
						v |= digittoint(s[i+1]);
						i++;
						if (i+1 < length && s[i+1] <= '7' && s[i+1] >= '0')
						{
							v <<= 3;
							v |= digittoint(s[i+1]);
						}
					}
					c = (uint8_t)v;
					break;
				}
				case 'x':
				{
					++i;
					if (i >= length)
					{
						break;
					}
					int v = digittoint(s[i]);
					if (i+1 < length && ishexdigit(s[i+1]))
					{
						v <<= 4;
						v |= digittoint(s[++i]);
					}
					c = (uint8_t)v;
					break;
				}
			}
		}
		buffer.push_back(c);
	}
}